

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.hpp
# Opt level: O2

size_t pstore::serialize::string_helper::read_length<pstore::serialize::archive::database_reader&>
                 (database_reader *archive)

{
  int line;
  uint size;
  uint64_t uVar1;
  char *str;
  span<unsigned_char,__1L> sVar2;
  array<unsigned_char,_9UL> encoded_length;
  
  encoded_length._M_elems[8] = '\0';
  encoded_length._M_elems[0] = '\0';
  encoded_length._M_elems[1] = '\0';
  encoded_length._M_elems[2] = '\0';
  encoded_length._M_elems[3] = '\0';
  encoded_length._M_elems[4] = '\0';
  encoded_length._M_elems[5] = '\0';
  encoded_length._M_elems[6] = '\0';
  encoded_length._M_elems[7] = '\0';
  sVar2 = gsl::make_span<unsigned_char>(encoded_length._M_elems,2);
  serialize::archive::database_reader::getn<pstore::gsl::span<unsigned_char,_1l>,void>
            (archive,sVar2);
  size = varint::decode_size<unsigned_char*>(encoded_length._M_elems);
  if (size == 0) {
    str = "varint_length > 0";
    line = 0x54;
LAB_0010d7fe:
    assert_failed(str,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/standard_types.hpp"
                  ,line);
  }
  if (2 < size) {
    if (9 < size) {
      str = "varint_length <= encoded_length.size ()";
      line = 0x58;
      goto LAB_0010d7fe;
    }
    sVar2 = gsl::make_span<unsigned_char>(encoded_length._M_elems + 2,(ulong)(size - 2));
    serialize::archive::database_reader::getn<pstore::gsl::span<unsigned_char,_1l>,void>
              (archive,sVar2);
  }
  uVar1 = varint::decode<unsigned_char*>(encoded_length._M_elems,size);
  return uVar1;
}

Assistant:

static std::size_t read_length (Archive && archive) {
                std::array<std::uint8_t, varint::max_output_length> encoded_length{{0}};
                // First read the two initial bytes. These contain the variable length value
                // but might not be enough for the entire value.
                static_assert (varint::max_output_length >= 2,
                               "maximum encoded varint length must be >= 2");
                serialize::read_uninit (archive, gsl::make_span (encoded_length.data (), 2));

                auto const varint_length = varint::decode_size (std::begin (encoded_length));
                PSTORE_ASSERT (varint_length > 0);
                // Was that initial read of 2 bytes enough? If not get the rest of the
                // length value.
                if (varint_length > 2) {
                    PSTORE_ASSERT (varint_length <= encoded_length.size ());
                    serialize::read_uninit (
                        archive, gsl::make_span (encoded_length.data () + 2, varint_length - 2));
                }

                return varint::decode (encoded_length.data (), varint_length);
            }